

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O2

void __thiscall
FillCellHelper::insertDecoration(FillCellHelper *this,ReportBuilder *builder,QTextDocument *textDoc)

{
  char cVar1;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QString name;
  undefined1 local_60 [32];
  QImage img;
  
  qvariant_cast<QImage>((QVariant *)&img);
  cVar1 = QImage::isNull();
  if (cVar1 != '\0') {
    qvariant_cast<QIcon>((QVariant *)&local_98);
    QIcon::pixmap((QSize *)&name,(Mode)&local_98,(State)this);
    QPixmap::toImage();
    QImage::operator=(&img,(QImage *)local_60);
    QImage::~QImage((QImage *)local_60);
    QPixmap::~QPixmap((QPixmap *)&name);
    QIcon::~QIcon((QIcon *)&local_98.shared);
  }
  cVar1 = QImage::isNull();
  if (cVar1 == '\0') {
    local_60._0_8_ = (PrivateShared *)0x0;
    local_60._8_8_ = L"cell-image%1.png";
    local_60._16_8_ = 0x10;
    local_98._16_8_ = 0;
    local_98.shared = (PrivateShared *)0x0;
    local_98._8_8_ = 0;
    insertDecoration::imageNumber = insertDecoration::imageNumber + 1;
    QString::arg(&name,(QString *)local_60,insertDecoration::imageNumber,0,10,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QUrl::QUrl((QUrl *)&local_98.shared,(QString *)&name,TolerantMode);
    QImage::operator_cast_to_QVariant((QVariant *)local_60,&img);
    QTextDocument::addResource((int)textDoc,(QUrl *)0x2,(QVariant *)&local_98);
    QVariant::~QVariant((QVariant *)local_60);
    QUrl::~QUrl((QUrl *)&local_98.shared);
    KDReports::TextDocumentData::addResourceName(builder->m_contentDocument,&name);
    QTextCursor::insertImage((QString *)&this->cellCursor);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&name.d);
  }
  QImage::~QImage(&img);
  return;
}

Assistant:

void FillCellHelper::insertDecoration(KDReports::ReportBuilder &builder, QTextDocument &textDoc)
{
    QImage img = qvariant_cast<QImage>(cellDecoration);
    if (img.isNull()) {
        img = qvariant_cast<QIcon>(cellDecoration).pixmap(iconSize).toImage();
    }
    if (!img.isNull()) {
        static int imageNumber = 0;
        const QString name = QStringLiteral("cell-image%1.png").arg(++imageNumber);
        textDoc.addResource(QTextDocument::ImageResource, QUrl(name), img);
        builder.currentDocumentData().addResourceName(name);
        cellCursor.insertImage(name);
    }
}